

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

bool chrono::utils::AddTriangleMeshConvexDecompositionV2
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,bool use_original_asset,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  ChVisualModel *pCVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ostream *this;
  ChTriangleMeshShape *pCVar15;
  _func_int **pp_Var16;
  long lVar17;
  element_type **size;
  size_t size_00;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape_1;
  ChConvexDecompositionHACDv2 mydecompositionHACDv2;
  stringstream ss;
  ChVisualModel *local_3d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3d0;
  long local_3c8;
  ChTriangleMeshShape *local_3c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8;
  uint local_3ac;
  string *local_3a8;
  undefined1 local_3a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_388;
  pointer pCStack_380;
  pointer local_378;
  shared_ptr<chrono::ChVisualShape> local_370;
  shared_ptr<chrono::ChVisualMaterial> local_360;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_350;
  shared_ptr<chrono::ChVisualShape> local_340;
  shared_ptr<chrono::ChVisualMaterial> local_330;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_320;
  element_type *local_310;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  shared_ptr<chrono::ChVisualModel> local_300;
  pointer local_2f0;
  pointer local_2e8;
  pointer local_2e0;
  shared_ptr<chrono::ChMaterialSurface> *local_2d8;
  ChVisualModel *local_2d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b0;
  double local_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  ChMatrix33<double> local_280;
  ChConvexDecompositionHACDv2 local_238;
  undefined1 local_1b8 [16];
  double dStack_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  undefined1 local_178 [328];
  
  local_3a8 = name;
  local_2d8 = material;
  ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
  uVar11 = local_1b8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
  }
  if ((_func_int **)uVar11 == (_func_int **)0x0) {
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    local_300.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var14 + 1);
    p_Var14[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[1]._M_use_count = 0;
    p_Var14[1]._M_weak_count = 0;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[2]._M_use_count = 0;
    p_Var14[2]._M_weak_count = 0;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[2]._M_use_count = 0;
    p_Var14[2]._M_weak_count = 0;
    p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[3]._M_use_count = 0;
    p_Var14[3]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = 2;
    }
    local_300.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var14;
    ChPhysicsItem::AddVisualModel(&body->super_ChPhysicsItem,&local_300);
    if (local_300.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_300.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_3a0,obj_filename,true,false);
  if ((_func_int **)local_3a0._0_8_ == (_func_int **)0x0) {
    bVar7 = false;
  }
  else {
    lVar17 = (long)(((ChTriangleMesh *)(local_3a0._0_8_ + 0x10))->super_ChGeometry)._vptr_ChGeometry
             - (long)(((ChTriangleMesh *)(local_3a0._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry;
    if (lVar17 != 0) {
      lVar17 = (lVar17 >> 3) * -0x5555555555555555;
      lVar17 = lVar17 + (ulong)(lVar17 == 0);
      pp_Var16 = (((ChTriangleMesh *)(local_3a0._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry + 2;
      auVar19 = ZEXT816(0xbff0000000000000);
      auVar20 = ZEXT816(0x4000000000000000);
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[1];
        dVar8 = dVar1 * dVar1;
        dVar3 = rot->m_data[2];
        dVar4 = rot->m_data[3];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar8 + dVar2 * dVar2;
        auVar25 = vfmadd213sd_fma(auVar25,auVar20,auVar19);
        dVar9 = dVar2 * dVar3 - dVar4 * dVar1;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = pp_Var16[-2];
        p_Var5 = pp_Var16[-1];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = (double)p_Var5 * (dVar9 + dVar9);
        auVar25 = vfmadd231sd_fma(auVar30,auVar31,auVar25);
        dVar9 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *pp_Var16;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar9 + dVar9;
        auVar25 = vfmadd213sd_fma(auVar26,auVar32,auVar25);
        dVar9 = dVar2 * dVar3 + dVar4 * dVar1;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar8 + dVar3 * dVar3;
        auVar26 = vfmadd213sd_fma(auVar28,auVar20,auVar19);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar9 + dVar9;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (double)p_Var5 * auVar26._0_8_;
        auVar26 = vfmadd231sd_fma(auVar29,auVar31,auVar21);
        dVar9 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar9 + dVar9;
        auVar26 = vfmadd213sd_fma(auVar22,auVar32,auVar26);
        dVar9 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar1 = dVar1 * dVar2 + dVar4 * dVar3;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar9 + dVar9;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (double)p_Var5 * (dVar1 + dVar1);
        auVar22 = vfmadd231sd_fma(auVar27,auVar31,auVar23);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar4 * dVar4 + dVar8;
        auVar21 = vfmadd213sd_fma(auVar24,auVar20,auVar19);
        auVar21 = vfmadd213sd_fma(auVar21,auVar32,auVar22);
        dVar1 = pos->m_data[1];
        dVar2 = pos->m_data[2];
        pp_Var16[-2] = (_func_int *)(auVar25._0_8_ + pos->m_data[0]);
        pp_Var16[-1] = (_func_int *)(auVar26._0_8_ + dVar1);
        *pp_Var16 = (_func_int *)(auVar21._0_8_ + dVar2);
        pp_Var16 = pp_Var16 + 3;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&local_238);
    collision::ChConvexDecompositionHACDv2::Reset(&local_238);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&local_238,(ChTriangleMesh *)local_3a0._0_8_);
    size = (element_type **)0x400;
    collision::ChConvexDecompositionHACDv2::SetParameters
              (&local_238,0x400,0x100,0x40,0.01,0.0,1e-06);
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&local_238);
    uVar12 = (*local_238.super_ChConvexDecomposition._vptr_ChConvexDecomposition[7])();
    bVar7 = (int)uVar12 < 1;
    if (0 < (int)uVar12) {
      local_2e0 = (pointer)&PTR___Sp_counted_ptr_inplace_00b66ac8;
      local_2e8 = (pointer)&PTR__ChTriangleMeshConnected_00b669b8;
      local_2f0 = (pointer)&PTR__ChFrame_00b2b308;
      size_00 = 0;
      local_3ac = uVar12;
      do {
        local_3d8 = (ChVisualModel *)0x0;
        p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_3c8 = 0;
        iVar18 = (int)size_00;
        iVar13 = (*local_238.super_ChConvexDecomposition._vptr_ChConvexDecomposition[9])
                           (&local_238,size_00,&local_3d8);
        if ((char)iVar13 == '\0') {
LAB_0093ceed:
          if (local_3d8 != (ChVisualModel *)0x0) {
            operator_delete(local_3d8,local_3c8 - (long)local_3d8);
          }
          goto LAB_0093d085;
        }
        peVar6 = (body->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var14 = (body->collision_model).
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        local_310 = (local_2d8->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        local_308 = (local_2d8->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_308->_M_use_count = local_308->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_308->_M_use_count = local_308->_M_use_count + 1;
          }
        }
        ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1b8,rot);
        size = &local_310;
        (*peVar6->_vptr_ChCollisionModel[0xf])
                  (peVar6,size,&local_3d8,pos,(ChMatrix33<double> *)local_1b8);
        if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308);
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        if (!use_original_asset) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          this = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&dStack_1a8,(local_3a8->_M_dataplus)._M_p,
                            local_3a8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(this,"_",1);
          std::ostream::operator<<(this,iVar18);
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
          p_Var14->_M_use_count = 1;
          p_Var14->_M_weak_count = 1;
          p_Var14->_vptr__Sp_counted_base = (_func_int **)local_2e0;
          p_Var14[1]._vptr__Sp_counted_base = (_func_int **)local_2e8;
          p_Var14[1]._M_use_count = 0;
          p_Var14[1]._M_weak_count = 0;
          p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[2]._M_use_count = 0;
          p_Var14[2]._M_weak_count = 0;
          p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[3]._M_use_count = 0;
          p_Var14[3]._M_weak_count = 0;
          p_Var14[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[4]._M_use_count = 0;
          p_Var14[4]._M_weak_count = 0;
          p_Var14[5]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[5]._M_use_count = 0;
          p_Var14[5]._M_weak_count = 0;
          p_Var14[6]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[6]._M_use_count = 0;
          p_Var14[6]._M_weak_count = 0;
          p_Var14[7]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[7]._M_use_count = 0;
          p_Var14[7]._M_weak_count = 0;
          p_Var14[8]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[8]._M_use_count = 0;
          p_Var14[8]._M_weak_count = 0;
          p_Var14[9]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[9]._M_use_count = 0;
          p_Var14[9]._M_weak_count = 0;
          p_Var14[10]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[10]._M_use_count = 0;
          p_Var14[10]._M_weak_count = 0;
          p_Var14[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xb]._M_use_count = 0;
          p_Var14[0xb]._M_weak_count = 0;
          p_Var14[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xc]._M_use_count = 0;
          p_Var14[0xc]._M_weak_count = 0;
          p_Var14[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xb]._M_use_count = 0;
          p_Var14[0xb]._M_weak_count = 0;
          p_Var14[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xc]._M_use_count = 0;
          p_Var14[0xc]._M_weak_count = 0;
          p_Var14[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xd]._M_use_count = 0;
          p_Var14[0xd]._M_weak_count = 0;
          p_Var14[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var14[0xe]._M_use_count = 0;
          p_Var14[0xe]._M_weak_count = 0;
          p_Var14[0xf]._vptr__Sp_counted_base = (_func_int **)(p_Var14 + 0x10);
          p_Var14[0xf]._M_use_count = 0;
          p_Var14[0xf]._M_weak_count = 0;
          *(undefined1 *)&p_Var14[0x10]._vptr__Sp_counted_base = 0;
          iVar13 = (*local_238.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                             (&local_238,size_00,(element_type *)(p_Var14 + 1));
          if ((char)iVar13 == '\0') {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
          }
          else {
            pCVar15 = (ChTriangleMeshShape *)
                      ChVisualShape::operator_new((ChVisualShape *)0x98,size_00);
            ChTriangleMeshShape::ChTriangleMeshShape(pCVar15);
            local_3c0 = pCVar15;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::ChTriangleMeshShape*>(&local_3b8,pCVar15);
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
            local_320.
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)(p_Var14 + 1);
            local_320.
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var14;
            ChTriangleMeshShape::SetMesh(local_3c0,&local_320,true);
            if (local_320.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_320.
                         super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            pCVar15 = local_3c0;
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_assign((string *)&pCVar15->name);
            if ((pointer)local_2c0._0_8_ != (pointer)(local_2c0 + 0x10)) {
              operator_delete((void *)local_2c0._0_8_,aStack_2b0._M_allocated_capacity + 1);
            }
            local_330.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (vis_material->
                     super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_330.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (vis_material->
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_330.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_330.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_330.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_330.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_330.
                      super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            ChVisualShape::AddMaterial(&local_3c0->super_ChVisualShape,&local_330);
            if (local_330.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_330.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
            pCVar10 = local_2d0;
            local_340.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_3c0->super_ChVisualShape;
            local_340.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = local_3b8._M_pi;
            if (local_3b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_3b8._M_pi)->_M_use_count = (local_3b8._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_3b8._M_pi)->_M_use_count = (local_3b8._M_pi)->_M_use_count + 1;
              }
            }
            local_3a0._16_8_ = (ChTriangleMeshShape *)0x3ff0000000000000;
            local_378 = (pointer)0x0;
            local_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pCStack_380 = (pointer)0x0;
            local_2c0._0_8_ = local_2f0;
            aStack_2b0._8_8_ = 0;
            local_2c0._8_8_ = 0.0;
            aStack_2b0._M_allocated_capacity = 0;
            local_2a0 = 1.0;
            local_288 = 0.0;
            local_298 = 0.0;
            dStack_290 = 0.0;
            ChMatrix33<double>::ChMatrix33(&local_280,(ChQuaternion<double> *)(local_3a0 + 0x10));
            ChVisualModel::AddShape(pCVar10,&local_340,(ChFrame<double> *)local_2c0);
            if (local_340.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_340.
                         super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
            }
            if (local_3b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b8._M_pi);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
            size = (element_type **)&std::__cxx11::stringstream::VTT;
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
            if ((char)iVar13 != '\0') goto LAB_0093ce20;
          }
          goto LAB_0093ceed;
        }
LAB_0093ce20:
        if (local_3d8 != (ChVisualModel *)0x0) {
          size = (element_type **)(local_3c8 - (long)local_3d8);
          operator_delete(local_3d8,(ulong)size);
        }
        uVar12 = iVar18 + 1;
        size_00 = (size_t)uVar12;
        bVar7 = (int)local_3ac <= (int)uVar12;
      } while (uVar12 != local_3ac);
    }
    if (use_original_asset) {
      pCVar15 = (ChTriangleMeshShape *)
                ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
      ChTriangleMeshShape::ChTriangleMeshShape(pCVar15);
      local_3a0._16_8_ = pCVar15;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
                (&local_388,pCVar15);
      local_350.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_3a0._0_8_;
      local_350.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_3a0._8_8_ + 8) = *(_Atomic_word *)(local_3a0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_3a0._8_8_ + 8) = *(_Atomic_word *)(local_3a0._8_8_ + 8) + 1;
        }
      }
      ChTriangleMeshShape::SetMesh((ChTriangleMeshShape *)local_3a0._16_8_,&local_350,true);
      if (local_350.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_350.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)(local_3a0._16_8_ + 0x40));
      local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChVisualShape::AddMaterial((ChVisualShape *)local_3a0._16_8_,&local_360);
      if (local_360.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_360.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
      pCVar10 = local_3d8;
      local_370.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3a0._16_8_;
      local_370.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_388._M_pi;
      if (local_388._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_388._M_pi)->_M_use_count = (local_388._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_388._M_pi)->_M_use_count = (local_388._M_pi)->_M_use_count + 1;
        }
      }
      local_2c0._0_8_ = (pointer)0x3ff0000000000000;
      local_2c0._8_8_ = 0.0;
      aStack_2b0._M_allocated_capacity = 0;
      aStack_2b0._8_8_ = 0;
      local_1b8._0_8_ = &PTR__ChFrame_00b2b308;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      dStack_1a8 = 0.0;
      local_1a0 = 0.0;
      local_198 = 1.0;
      local_190 = 0.0;
      dStack_188 = 0.0;
      local_180 = 0.0;
      ChMatrix33<double>::ChMatrix33
                ((ChMatrix33<double> *)local_178,(ChQuaternion<double> *)local_2c0);
      ChVisualModel::AddShape(pCVar10,&local_370,(ChFrame<double> *)local_1b8);
      if (local_370.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_370.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Stack_3d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3d0);
      }
      if (local_388._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_388._M_pi);
      }
    }
LAB_0093d085:
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&local_238);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0._8_8_);
  }
  return bVar7;
}

Assistant:

bool AddTriangleMeshConvexDecompositionV2(ChBody* body,
                                          std::shared_ptr<ChMaterialSurface> material,
                                          const std::string& obj_filename,
                                          const std::string& name,
                                          const ChVector<>& pos,
                                          const ChQuaternion<>& rot,
                                          bool use_original_asset,
                                          std::shared_ptr<ChVisualMaterial> vis_material) {
    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 mydecompositionHACDv2;

    int hacd_maxhullcount = 1024;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    double hacd_concavity = 0.01;
    double hacd_smallclusterthreshold = 0.0;
    double hacd_fusetolerance = 1e-6;

    mydecompositionHACDv2.Reset();
    mydecompositionHACDv2.AddTriangleMesh(*trimesh);

    mydecompositionHACDv2.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes,
                                        (float)hacd_concavity, (float)hacd_smallclusterthreshold,
                                        (float)hacd_fusetolerance);
    mydecompositionHACDv2.ComputeConvexDecomposition();
    collision::ChConvexDecomposition* used_decomposition = &mydecompositionHACDv2;

    int hull_count = used_decomposition->GetHullCount();

    for (int c = 0; c < hull_count; c++) {
        std::vector<ChVector<double>> convexhull;
        if (!used_decomposition->GetConvexHullResult(c, convexhull))
            return false;

        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        if (!use_original_asset) {
            std::stringstream ss;
            ss << name << "_" << c;
            auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
            if (!used_decomposition->GetConvexHullResult(c, *trimesh_convex))
                return false;

            auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
            trimesh_shape->SetMesh(trimesh_convex);
            trimesh_shape->SetName(ss.str());
            trimesh_shape->AddMaterial(vis_material);
            body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
        }
    }
    if (use_original_asset) {
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}